

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

btCompoundShape * __thiscall
btCollisionWorldImporter::createCompoundShape(btCollisionWorldImporter *this)

{
  btCompoundShape *this_00;
  btCompoundShape *local_18;
  
  this_00 = (btCompoundShape *)btCompoundShape::operator_new(0x80);
  btCompoundShape::btCompoundShape(this_00,true,0);
  local_18 = this_00;
  btAlignedObjectArray<btCollisionShape_*>::push_back
            (&this->m_allocatedCollisionShapes,(btCollisionShape **)&local_18);
  return this_00;
}

Assistant:

btCompoundShape* btCollisionWorldImporter::createCompoundShape()
{
	btCompoundShape* shape = new btCompoundShape();
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}